

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_ExrIO_Test::TestBody(Image_ExrIO_Test *this)

{
  PixelFormat format_00;
  RGBColorSpace *expected;
  bool bVar1;
  Allocator AVar2;
  RGBColorSpace *actual;
  long lVar3;
  ulong uVar4;
  long lVar5;
  Point2i PVar6;
  char *pcVar7;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar8
  ;
  char *pcVar9;
  ColorEncodingHandle *encoding;
  float *expected_00;
  long lVar10;
  long lVar11;
  int iVar12;
  Float FVar13;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> buf;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c0;
  AssertionResult gtest_ar__1;
  PixelFormat format;
  AssertHelper local_5a0;
  ulong local_598;
  AssertionResult gtest_ar_;
  undefined1 local_580 [48];
  string local_550 [32];
  ulong local_530;
  undefined1 *local_528;
  anon_union_128_1_a7e8d694_for_InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_5
  *local_520;
  ImageChannelDesc rgbDesc;
  WrapMode2D local_4d0;
  WrapMode2D local_4c8;
  WrapMode2D local_4c0;
  WrapMode2D local_4b8;
  ColorEncodingHandle local_4b0;
  WrapMode2D local_4a8;
  WrapMode2D local_4a0;
  ColorEncodingHandle local_498;
  PixelFormat local_48c [3];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  ImageMetadata metadata;
  ImageAndMetadata read;
  Image image;
  
  GetFloatPixels(&rgbPixels,(Point2i)0x3100000010,3);
  local_48c[0] = U256;
  local_48c[1] = Half;
  local_520 = &read.image.channelNames.field_2;
  local_48c[2] = 2;
  local_528 = local_580 + 0x10;
  lVar3 = 0;
  do {
    if (lVar3 == 0xc) {
LAB_00347021:
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&rgbPixels);
      return;
    }
    format_00 = *(PixelFormat *)((long)local_48c + lVar3);
    format = format_00;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&read,"R",(allocator<char> *)&metadata);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)read.image.channelNames.field_2.fixed,"G",(allocator<char> *)&gtest_ar_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(read.image.channelNames.field_2.fixed + 1),"B",(allocator<char> *)&rgbDesc
              );
    local_498.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )pbrt::ColorEncodingHandle::Linear.bits;
    AVar2.memoryResource = pstd::pmr::new_delete_resource();
    encoding = &local_498;
    channels.n = 3;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&read;
    pbrt::Image::Image(&image,format_00,(Point2i)0x3100000010,channels,encoding,AVar2);
    lVar5 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&read.image.format + lVar5));
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x20);
    read.image.format = U256;
    read.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
    read.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = 0x10;
    read.image._12_4_ = 0x31;
    buf.n = rgbPixels.nStored;
    buf.ptr = rgbPixels.ptr;
    pbrt::Image::CopyRectIn(&image,(Bounds2i *)&read,buf);
    lVar5 = 0;
    iVar12 = 0;
    while( true ) {
      if (lVar5 == 0x31) break;
      uVar4 = 0;
      while (uVar4 != 0x10) {
        local_598 = CONCAT44(local_598._4_4_,iVar12);
        lVar10 = (long)iVar12 << 2;
        PVar6.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar5 << 0x20 | uVar4);
        local_530 = uVar4;
        for (iVar12 = 0; iVar12 != 3; iVar12 = iVar12 + 1) {
          if (format == Float) {
            expected_00 = (float *)((long)rgbPixels.ptr + lVar10);
            pbrt::WrapMode2D::WrapMode2D(&local_4a8,Clamp);
            metadata.renderTimeSeconds.optionalValue =
                 (aligned_storage_t<sizeof(float),_alignof(float)>)
                 pbrt::Image::GetChannel(&image,PVar6,iVar12,local_4a8);
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&read,"rgbPixels[offset]","image.GetChannel({x, y}, c)",
                       expected_00,(float *)&metadata);
            if ((undefined1)read.image.format != U256) {
LAB_00346684:
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&read.image.resolution.super_Tuple2<pbrt::Point2,_int>.y);
              goto LAB_00346691;
            }
            testing::Message::Message((Message *)&metadata);
            if ((undefined8 *)
                CONCAT44(read.image._12_4_,read.image.resolution.super_Tuple2<pbrt::Point2,_int>.y)
                == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)CONCAT44(read.image._12_4_,
                                          read.image.resolution.super_Tuple2<pbrt::Point2,_int>.y);
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0x159,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_,(Message *)&metadata);
LAB_00346ff0:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&metadata);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&read.image.resolution.super_Tuple2<pbrt::Point2,_int>.y);
            goto LAB_00347014;
          }
          if (format == Half) {
            pbrt::Half::Half((Half *)&rgbDesc,*(float *)((long)rgbPixels.ptr + lVar10));
            metadata.renderTimeSeconds.optionalValue =
                 (aligned_storage_t<sizeof(float),_alignof(float)>)
                 pbrt::Half::operator_cast_to_float((Half *)&rgbDesc);
            pbrt::WrapMode2D::WrapMode2D(&local_4a0,Clamp);
            gtest_ar_._0_4_ = pbrt::Image::GetChannel(&image,PVar6,iVar12,local_4a0);
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&read,"Float(Half(rgbPixels[offset]))",
                       "image.GetChannel({x, y}, c)",(float *)&metadata,(float *)&gtest_ar_);
            if ((undefined1)read.image.format != U256) goto LAB_00346684;
            testing::Message::Message((Message *)&metadata);
            if ((undefined8 *)
                CONCAT44(read.image._12_4_,read.image.resolution.super_Tuple2<pbrt::Point2,_int>.y)
                == (undefined8 *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)CONCAT44(read.image._12_4_,
                                          read.image.resolution.super_Tuple2<pbrt::Point2,_int>.y);
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0x157,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_,(Message *)&metadata);
            goto LAB_00346ff0;
          }
LAB_00346691:
          lVar10 = lVar10 + 4;
        }
        iVar12 = (int)local_598 + 3;
        uVar4 = local_530 + 1;
      }
      lVar5 = lVar5 + 1;
    }
    metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
    metadata.renderTimeSeconds.set = false;
    metadata.cameraFromWorld.set = false;
    metadata.NDCFromWorld.set = false;
    metadata.pixelBounds.set = false;
    metadata.fullResolution.set = false;
    metadata.samplesPerPixel.set = false;
    metadata.MSE.set = false;
    metadata.colorSpace.set = false;
    metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
              (&metadata.colorSpace,&pbrt::RGBColorSpace::ACES2065_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&read,"test.exr",(allocator<char> *)&rgbDesc);
    bVar1 = pbrt::Image::Write(&image,(string *)&read,&metadata);
    gtest_ar_.success_ = bVar1;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__cxx11::string::~string((string *)&read);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&rgbDesc);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&read,(internal *)&gtest_ar_,
                 (AssertionResult *)"image.Write(\"test.exr\", metadata)","false","true",
                 (char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x15e,(char *)CONCAT44(read.image.resolution.super_Tuple2<pbrt::Point2,_int>.x,
                                         read.image.format));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&rgbDesc);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
      std::__cxx11::string::~string((string *)&read);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&rgbDesc);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"test.exr",(allocator<char> *)&rgbDesc);
    AVar2.memoryResource = pstd::pmr::new_delete_resource();
    local_4b0.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    pbrt::Image::Read(&read,(string *)&gtest_ar_,AVar2,&local_4b0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    pcVar9 = (char *)CONCAT44(read.image.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                              read.image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
    rgbDesc.offset.alloc.memoryResource =
         (memory_resource *)image.resolution.super_Tuple2<pbrt::Point2,_int>;
    gtest_ar__1._0_8_ = pcVar9;
    testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
              ((internal *)&gtest_ar_,"image.Resolution()","read.image.Resolution()",
               (Point2<int> *)&rgbDesc,(Point2<int> *)&gtest_ar__1);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&rgbDesc);
      pcVar7 = "";
      if (gtest_ar_.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x162,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&rgbDesc);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&rgbDesc);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    expected = pbrt::RGBColorSpace::ACES2065_1;
    actual = pbrt::ImageMetadata::GetColorSpace(&read.metadata);
    testing::internal::CmpHelperEQ<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
              ((internal *)&gtest_ar_,"*RGBColorSpace::ACES2065_1","*read.metadata.GetColorSpace()",
               expected,actual);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&rgbDesc);
      pcVar7 = "";
      if (gtest_ar_.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x163,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&rgbDesc);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&rgbDesc);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    if (format != U256) {
      rgbDesc.offset.alloc.memoryResource._0_4_ = read.image.format;
      testing::internal::CmpHelperEQ<pbrt::PixelFormat,pbrt::PixelFormat>
                ((internal *)&gtest_ar_,"read.image.Format()","format",(PixelFormat *)&rgbDesc,
                 &format);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&rgbDesc);
        pcVar7 = "";
        if (gtest_ar_.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x165,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&rgbDesc)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&rgbDesc);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_,"R",(allocator<char> *)&gtest_ar__1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_580 + 0x10),"G",(allocator<char> *)&local_5c0);
    std::__cxx11::string::string<std::allocator<char>>(local_550,"B",(allocator<char> *)&local_5a0);
    requestedChannels.n = 3;
    requestedChannels.ptr = (string *)&gtest_ar_;
    pbrt::Image::GetChannelDesc(&rgbDesc,&read.image,requestedChannels);
    lVar5 = 0x40;
    do {
      std::__cxx11::string::~string((string *)(local_580 + lVar5 + -0x10));
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x20);
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar__1.success_ = rgbDesc.offset.nStored != 0;
    if (rgbDesc.offset.nStored == 0) {
      testing::Message::Message((Message *)&local_5c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"bool(rgbDesc)",
                 "false","true",pcVar9);
      testing::internal::AssertHelper::AssertHelper
                (&local_5a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x168,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
      testing::internal::AssertHelper::operator=(&local_5a0,(Message *)&local_5c0);
      testing::internal::AssertHelper::~AssertHelper(&local_5a0);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_5c0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar__1.message_);
      pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&rgbDesc.offset);
      pbrt::ImageAndMetadata::~ImageAndMetadata(&read);
      pbrt::ImageMetadata::~ImageMetadata(&metadata);
LAB_00347014:
      pbrt::Image::~Image(&image);
      goto LAB_00347021;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__1.message_);
    lVar5 = 0;
    while( true ) {
      if (lVar5 == 0x31) break;
      local_530 = lVar5 << 0x20;
      uVar4 = 0;
      while (uVar4 != 0x10) {
        pbrt::WrapMode2D::WrapMode2D(&local_4b8,Clamp);
        PVar6.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_530 | uVar4);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)&gtest_ar_,&read.image,PVar6,&rgbDesc,local_4b8);
        lVar11 = 0;
        local_598 = uVar4;
        for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
          iVar12 = (int)lVar10;
          if (format == Half) {
            pbrt::WrapMode2D::WrapMode2D(&local_4c8,Clamp);
            FVar13 = pbrt::Image::GetChannel(&image,PVar6,iVar12,local_4c8);
            pbrt::Half::Half((Half *)&local_5a0,FVar13);
            local_5c0.ptr_._0_4_ = pbrt::Half::operator_cast_to_float((Half *)&local_5a0);
            sVar8 = gtest_ar_.message_;
            if (gtest_ar_.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              sVar8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_580;
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&gtest_ar__1,"Float(Half(image.GetChannel({x, y}, c)))","v[c]",
                       (float *)&local_5c0,
                       (float *)((long)&((sVar8.ptr_)->_M_dataplus)._M_p + lVar11));
            if (gtest_ar__1.success_ == false) {
              testing::Message::Message((Message *)&local_5c0);
              pcVar9 = "";
              if (gtest_ar__1.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_5a0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x171,pcVar9);
              testing::internal::AssertHelper::operator=(&local_5a0,(Message *)&local_5c0);
              goto LAB_00346e12;
            }
          }
          else if (format == U256) {
            pbrt::WrapMode2D::WrapMode2D(&local_4c0,Clamp);
            FVar13 = pbrt::Image::GetChannel(&image,PVar6,iVar12,local_4c0);
            pbrt::Half::Half((Half *)&local_5a0,FVar13);
            local_5c0.ptr_._0_4_ = pbrt::Half::operator_cast_to_float((Half *)&local_5a0);
            sVar8 = gtest_ar_.message_;
            if (gtest_ar_.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              sVar8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_580;
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&gtest_ar__1,"Float(Half(image.GetChannel({x, y}, c)))","v[c]",
                       (float *)&local_5c0,
                       (float *)((long)&((sVar8.ptr_)->_M_dataplus)._M_p + lVar11));
            if (gtest_ar__1.success_ == false) {
              testing::Message::Message((Message *)&local_5c0);
              pcVar9 = "";
              if (gtest_ar__1.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_5a0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x16f,pcVar9);
              testing::internal::AssertHelper::operator=(&local_5a0,(Message *)&local_5c0);
LAB_00346e12:
              testing::internal::AssertHelper::~AssertHelper(&local_5a0);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&local_5c0);
            }
          }
          else {
            pbrt::WrapMode2D::WrapMode2D(&local_4d0,Clamp);
            local_5c0.ptr_._0_4_ = pbrt::Image::GetChannel(&image,PVar6,iVar12,local_4d0);
            sVar8 = gtest_ar_.message_;
            if (gtest_ar_.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              sVar8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_580;
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&gtest_ar__1,"image.GetChannel({x, y}, c)","v[c]",
                       (float *)&local_5c0,
                       (float *)((long)&((sVar8.ptr_)->_M_dataplus)._M_p + lVar11));
            if (gtest_ar__1.success_ == false) {
              testing::Message::Message((Message *)&local_5c0);
              std::operator<<((ostream *)
                              (CONCAT44(local_5c0.ptr_._4_4_,local_5c0.ptr_._0_4_) + 0x10)," @ (");
              std::ostream::operator<<
                        ((void *)(CONCAT44(local_5c0.ptr_._4_4_,local_5c0.ptr_._0_4_) + 0x10),
                         (int)local_598);
              std::operator<<((ostream *)
                              (CONCAT44(local_5c0.ptr_._4_4_,local_5c0.ptr_._0_4_) + 0x10),", ");
              std::ostream::operator<<
                        ((void *)(CONCAT44(local_5c0.ptr_._4_4_,local_5c0.ptr_._0_4_) + 0x10),
                         (int)lVar5);
              std::operator<<((ostream *)
                              (CONCAT44(local_5c0.ptr_._4_4_,local_5c0.ptr_._0_4_) + 0x10),", ch ");
              std::ostream::operator<<
                        ((void *)(CONCAT44(local_5c0.ptr_._4_4_,local_5c0.ptr_._0_4_) + 0x10),iVar12
                        );
              std::operator<<((ostream *)
                              (CONCAT44(local_5c0.ptr_._4_4_,local_5c0.ptr_._0_4_) + 0x10),")");
              pcVar9 = "";
              if (gtest_ar__1.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar9 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_5a0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x173,pcVar9);
              testing::internal::AssertHelper::operator=(&local_5a0,(Message *)&local_5c0);
              goto LAB_00346e12;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar__1.message_);
          lVar11 = lVar11 + 4;
        }
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&gtest_ar_);
        uVar4 = local_598 + 1;
      }
      lVar5 = lVar5 + 1;
    }
    gtest_ar__1._0_8_ = gtest_ar__1._0_8_ & 0xffffffff00000000;
    local_5c0.ptr_._0_4_ = (float)remove("test.exr");
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_,"0","remove(\"test.exr\")",(int *)&gtest_ar__1,
               (int *)&local_5c0);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      pcVar9 = "";
      if (gtest_ar_.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_5c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x177,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_5c0,(Message *)&gtest_ar__1)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5c0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              (&rgbDesc.offset);
    pbrt::ImageAndMetadata::~ImageAndMetadata(&read);
    pbrt::ImageMetadata::~ImageMetadata(&metadata);
    pbrt::Image::~Image(&image);
    lVar3 = lVar3 + 4;
  } while( true );
}

Assistant:

TEST(Image, ExrIO) {
    Point2i res(16, 49);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        image.CopyRectIn({{0, 0}, res}, rgbPixels);

        // Check CopyRectIn()
        int offset = 0;
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < 3; ++c, ++offset) {
                    if (format == PixelFormat::U256)
                        ;
                    else if (format == PixelFormat::Half)
                        ASSERT_EQ(Float(Half(rgbPixels[offset])),
                                  image.GetChannel({x, y}, c));
                    else if (format == PixelFormat::Float)
                        ASSERT_EQ(rgbPixels[offset], image.GetChannel({x, y}, c));
                }

        ImageMetadata metadata;
        metadata.colorSpace = RGBColorSpace::ACES2065_1;
        EXPECT_TRUE(image.Write("test.exr", metadata));

        ImageAndMetadata read = Image::Read("test.exr");

        EXPECT_EQ(image.Resolution(), read.image.Resolution());
        EXPECT_EQ(*RGBColorSpace::ACES2065_1, *read.metadata.GetColorSpace());
        if (!Is8Bit(format))
            EXPECT_EQ(read.image.Format(), format);

        ImageChannelDesc rgbDesc = read.image.GetChannelDesc({"R", "G", "B"});
        ASSERT_TRUE(bool(rgbDesc));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues v = read.image.GetChannels({x, y}, rgbDesc);
                for (int c = 0; c < 3; ++c)
                    if (Is8Bit(format))
                        EXPECT_EQ(Float(Half(image.GetChannel({x, y}, c))), v[c]);
                    else if (Is16Bit(format))
                        EXPECT_EQ(Float(Half(image.GetChannel({x, y}, c))), v[c]);
                    else
                        EXPECT_EQ(image.GetChannel({x, y}, c), v[c])
                            << " @ (" << x << ", " << y << ", ch " << c << ")";
            }

        EXPECT_EQ(0, remove("test.exr"));
    }
}